

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CasePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CasePropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PropertyCaseItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          SyntaxList<slang::syntax::PropertyCaseItemSyntax> *args_4,Token *args_5)

{
  Token closeParen;
  Token endcase;
  CasePropertyExprSyntax *pCVar1;
  Info *in_RCX;
  SyntaxList<slang::syntax::PropertyCaseItemSyntax> *in_RDX;
  Token *in_RSI;
  Info *in_RDI;
  undefined8 *in_R8;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  
  pCVar1 = (CasePropertyExprSyntax *)
           allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  closeParen.info = in_RCX;
  closeParen._0_8_ = in_R8;
  endcase.info = in_RDI;
  endcase._0_8_ = in_RSI;
  slang::syntax::CasePropertyExprSyntax::CasePropertyExprSyntax
            ((CasePropertyExprSyntax *)in_R8[1],*in_RSI,*(Token *)&in_RDX->super_SyntaxListBase,
             (ExpressionSyntax *)*in_R8,closeParen,in_RDX,endcase);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }